

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void adjustlocalvars(LexState *ls,int nvars)

{
  char *pcVar1;
  int iVar2;
  LocVar *pLVar3;
  int iVar4;
  
  pcVar1 = (char *)((long)&ls->L + 2);
  *pcVar1 = *pcVar1 + (char)nvars;
  if (nvars != 0) {
    iVar4 = -nvars;
    do {
      iVar2 = (ls->lookahead).token;
      pLVar3 = getlocvar((FuncState *)ls,(uint)*(byte *)((long)&ls->L + 2) + iVar4);
      iVar4 = iVar4 + 1;
      pLVar3->startpc = iVar2;
    } while (iVar4 != 0);
  }
  if (((byte)ravi_parser_debug & 4) == 0) {
    return;
  }
  raviY_printf((FuncState *)ls,"adjustlocalvars -> set fs->nactvar to %d\n",
               (ulong)*(byte *)((long)&ls->L + 2));
  return;
}

Assistant:

static void adjustlocalvars (LexState *ls, int nvars) {
  FuncState *fs = ls->fs;
  fs->nactvar = cast_byte(fs->nactvar + nvars);
  for (; nvars; nvars--) {
    getlocvar(fs, fs->nactvar - nvars)->startpc = fs->pc;
  }
  DEBUG_VARS(raviY_printf(fs, "adjustlocalvars -> set fs->nactvar to %d\n", fs->nactvar));
}